

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::ProcessUse(BackwardPass *this,Opnd *opnd)

{
  Sym *pSVar1;
  ArrayRegOpnd *arrayRegOpnd;
  long lVar2;
  GlobOpt *this_00;
  Instr *pIVar3;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  BOOLEAN BVar7;
  BailOutKind BVar8;
  undefined8 in_RAX;
  undefined4 *puVar9;
  PropertySymOpnd *pPVar10;
  BVSparse<Memory::JitArenaAllocator> *pBVar11;
  byte bVar12;
  undefined8 uStack_38;
  ValueType valueType;
  
  uStack_38 = in_RAX;
  OVar5 = IR::Opnd::GetKind(opnd);
  if (OVar5 != OpndKindSym) {
    if (OVar5 == OpndKindIndir) {
      OVar5 = IR::Opnd::GetKind(opnd);
      if (OVar5 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar6) goto LAB_003e70c7;
        *puVar9 = 0;
      }
      arrayRegOpnd = (ArrayRegOpnd *)opnd[1]._vptr_Opnd;
      bVar6 = ProcessSymUse(this,&((arrayRegOpnd->super_RegOpnd).m_sym)->super_Sym,false,
                            (byte)(arrayRegOpnd->super_RegOpnd).super_Opnd.field_0xb >> 3 & 1);
      if (((bVar6) || (this->tag != BackwardPhase)) || (this->currentPrePassLoop != (Loop *)0x0)) {
        if (this->tag == DeadStorePhase) {
          bVar12 = (arrayRegOpnd->super_RegOpnd).super_Opnd.field_0xb & 0xfb | !bVar6 << 2;
          goto LAB_003e6c43;
        }
      }
      else {
        bVar12 = (arrayRegOpnd->super_RegOpnd).super_Opnd.field_0xb | 4;
LAB_003e6c43:
        (arrayRegOpnd->super_RegOpnd).super_Opnd.field_0xb = bVar12;
      }
      lVar2 = *(long *)&opnd[1].m_valueType;
      if (lVar2 != 0) {
        bVar6 = ProcessSymUse(this,*(Sym **)(lVar2 + 0x10),false,*(byte *)(lVar2 + 0xb) >> 3 & 1);
        if (((bVar6) || (this->tag != BackwardPhase)) || (this->currentPrePassLoop != (Loop *)0x0))
        {
          if (this->tag != DeadStorePhase) goto LAB_003e700d;
          bVar12 = *(byte *)(lVar2 + 0xb) & 0xfb | !bVar6 << 2;
        }
        else {
          bVar12 = *(byte *)(lVar2 + 0xb) | 4;
        }
        *(byte *)(lVar2 + 0xb) = bVar12;
      }
LAB_003e700d:
      if (this->isCollectionPass != false) {
        return;
      }
      DoMarkTempNumbersOnTempObjects(this);
      if (this->tag != DeadStorePhase) {
        return;
      }
      bVar6 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)arrayRegOpnd);
      if (!bVar6) {
        return;
      }
      pIVar3 = this->currentInstr;
      bVar6 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)arrayRegOpnd);
      if (bVar6) {
LAB_003e709c:
        ProcessArrayRegOpndUse(this,pIVar3,arrayRegOpnd);
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
      if (bVar6) {
        *puVar9 = 0;
        goto LAB_003e709c;
      }
      goto LAB_003e70c7;
    }
    if (OVar5 != OpndKindReg) {
      return;
    }
    OVar5 = IR::Opnd::GetKind(opnd);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar6) goto LAB_003e70c7;
      *puVar9 = 0;
    }
    pSVar1 = (Sym *)opnd[1]._vptr_Opnd;
    if (this->isCollectionPass == false) {
      if (((ushort)opnd[1].m_valueType.field_0 & 1) != 0) {
        uStack_38._0_6_ = CONCAT24((opnd->m_valueType).field_0.bits,(undefined4)uStack_38);
        bVar6 = ValueType::IsNotString((ValueType *)((long)&uStack_38 + 4));
        if (((bVar6) ||
            (BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                               (this->currentBlock->upwardExposedUses,pSVar1->m_id), BVar7 != '\0'))
           || ((*(uint *)&pSVar1[1]._vptr_Sym >> 0x13 & 1) != 0)) {
          *(byte *)&opnd[1].m_valueType.field_0 = *(byte *)&opnd[1].m_valueType.field_0 & 0xfe;
        }
      }
      CollectCloneStrCandidate(this,opnd);
    }
    bVar6 = ProcessSymUse(this,pSVar1,false,(byte)opnd->field_0xb >> 3 & 1);
    if (((bVar6) || (this->tag != BackwardPhase)) || (this->currentPrePassLoop != (Loop *)0x0)) {
      if (this->tag == DeadStorePhase) {
        bVar12 = opnd->field_0xb & 0xfb | !bVar6 << 2;
        goto LAB_003e6dbc;
      }
    }
    else {
      bVar12 = opnd->field_0xb | 4;
LAB_003e6dbc:
      opnd->field_0xb = bVar12;
    }
    if (this->isCollectionPass != false) {
      return;
    }
    if ((this->tag == DeadStorePhase) &&
       (bVar6 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)opnd), bVar6)) {
      pIVar3 = this->currentInstr;
      bVar6 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)opnd);
      if (!bVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
        if (!bVar6) goto LAB_003e70c7;
        *puVar9 = 0;
      }
      ProcessArrayRegOpndUse(this,pIVar3,(ArrayRegOpnd *)opnd);
    }
    if (this->currentInstr->m_opcode != BailOnNotArray) {
      return;
    }
    if (this->tag != DeadStorePhase) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1887,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
      if (!bVar6) goto LAB_003e70c7;
      *puVar9 = 0;
    }
    uStack_38 = CONCAT26((opnd->m_valueType).field_0.bits,(undefined6)uStack_38);
    bVar6 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)((long)&uStack_38 + 6));
    if (!bVar6) {
      return;
    }
    BVSparse<Memory::JitArenaAllocator>::Clear(this->currentBlock->noImplicitCallUses,pSVar1->m_id);
    bVar6 = ValueType::HasNoMissingValues((ValueType *)((long)&uStack_38 + 6));
    if (bVar6) {
      pBVar11 = this->currentBlock->noImplicitCallNoMissingValuesUses;
      do {
        pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)pBVar11->head;
        if (pBVar11 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003e6fc3;
      } while (((Type *)&pBVar11->alloc)->word == 0);
      if ((pBVar11 == (BVSparse<Memory::JitArenaAllocator> *)0x0) ||
         (this->currentPrePassLoop != (Loop *)0x0)) goto LAB_003e6fc3;
      BVar8 = IR::Instr::GetBailOutKind(this->currentInstr);
      if ((BVar8 != BailOutOnNotArray) &&
         (BVar8 = IR::Instr::GetBailOutKind(this->currentInstr), BVar8 != BailOutOnNotNativeArray))
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1898,
                           "(currentInstr->GetBailOutKind() == IR::BailOutOnNotArray || currentInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray)"
                           ,
                           "currentInstr->GetBailOutKind() == IR::BailOutOnNotArray || currentInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray"
                          );
        if (!bVar6) goto LAB_003e70c7;
        *puVar9 = 0;
      }
      pIVar3 = this->currentInstr;
      BVar8 = IR::Instr::GetBailOutKind(pIVar3);
      IR::Instr::SetBailOutKind(pIVar3,BVar8 | BailOutOnMissingValue);
    }
LAB_003e6fc3:
    BVSparse<Memory::JitArenaAllocator>::Clear
              (this->currentBlock->noImplicitCallNoMissingValuesUses,pSVar1->m_id);
    BVSparse<Memory::JitArenaAllocator>::Clear
              (this->currentBlock->noImplicitCallNativeArrayUses,pSVar1->m_id);
    return;
  }
  OVar5 = IR::Opnd::GetKind(opnd);
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar6) goto LAB_003e70c7;
    *puVar9 = 0;
  }
  pSVar1 = (Sym *)opnd[1]._vptr_Opnd;
  bVar6 = ProcessSymUse(this,pSVar1,false,(byte)opnd->field_0xb >> 3 & 1);
  if (((bVar6) || (this->tag != BackwardPhase)) || (this->currentPrePassLoop != (Loop *)0x0)) {
    if (this->tag == DeadStorePhase) {
      bVar12 = opnd->field_0xb & 0xfb | !bVar6 << 2;
      goto LAB_003e6cb3;
    }
  }
  else {
    bVar12 = opnd->field_0xb | 4;
LAB_003e6cb3:
    opnd->field_0xb = bVar12;
  }
  if ((this->isCollectionPass == false) && (pSVar1->m_kind == SymKindProperty)) {
    if (this->tag == BackwardPhase) {
      OVar5 = IR::Opnd::GetKind(opnd);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar6) {
LAB_003e70c7:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
      }
      bVar6 = IR::SymOpnd::IsPropertySymOpnd((SymOpnd *)opnd);
      if (bVar6) {
        this_00 = this->globOpt;
        pPVar10 = IR::Opnd::AsPropertySymOpnd(opnd);
        GlobOpt::PreparePropertySymOpndForTypeCheckSeq
                  (this_00,pPVar10,this->currentInstr,this->currentBlock->loop);
      }
    }
    DoMarkTempNumbersOnTempObjects(this);
    bVar6 = IR::SymOpnd::IsPropertySymOpnd((SymOpnd *)opnd);
    if (bVar6) {
      pPVar10 = IR::Opnd::AsPropertySymOpnd(opnd);
      ProcessPropertySymOpndUse(this,pPVar10);
      return;
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessUse(IR::Opnd * opnd)
{
    switch (opnd->GetKind())
    {
    case IR::OpndKindReg:
        {
            IR::RegOpnd *regOpnd = opnd->AsRegOpnd();
            StackSym *sym = regOpnd->m_sym;

            if (!IsCollectionPass())
            {
                // isTempLastUse is only used for string concat right now, so lets not mark it if it's not a string.
                // If it's upward exposed, it is not it's last use.
                if (regOpnd->m_isTempLastUse && (regOpnd->GetValueType().IsNotString() || this->currentBlock->upwardExposedUses->Test(sym->m_id) || sym->m_mayNotBeTempLastUse))
                {
                    regOpnd->m_isTempLastUse = false;
                }
                this->CollectCloneStrCandidate(opnd);
            }

            this->DoSetDead(regOpnd, !this->ProcessSymUse(sym, true, regOpnd->GetIsJITOptimizedReg()));

            if (IsCollectionPass())
            {
                break;
            }

            if (tag == Js::DeadStorePhase && regOpnd->IsArrayRegOpnd())
            {
                ProcessArrayRegOpndUse(currentInstr, regOpnd->AsArrayRegOpnd());
            }

            if (currentInstr->m_opcode == Js::OpCode::BailOnNotArray)
            {
                Assert(tag == Js::DeadStorePhase);

                const ValueType valueType(regOpnd->GetValueType());
                if(valueType.IsLikelyArrayOrObjectWithArray())
                {
                    currentBlock->noImplicitCallUses->Clear(sym->m_id);

                    // We are being conservative here to always check for missing value
                    // if any of them expect no missing value. That is because we don't know
                    // what set of sym is equivalent (copied) from the one we are testing for right now.
                    if(valueType.HasNoMissingValues() &&
                        !currentBlock->noImplicitCallNoMissingValuesUses->IsEmpty() &&
                        !IsPrePass())
                    {
                        // There is a use of this sym that requires this array to have no missing values, so this instruction
                        // needs to bail out if the array has missing values.
                        Assert(currentInstr->GetBailOutKind() == IR::BailOutOnNotArray ||
                               currentInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray);
                        currentInstr->SetBailOutKind(currentInstr->GetBailOutKind() | IR::BailOutOnMissingValue);
                    }

                    currentBlock->noImplicitCallNoMissingValuesUses->Clear(sym->m_id);
                    currentBlock->noImplicitCallNativeArrayUses->Clear(sym->m_id);
                }
            }
        }
        break;
    case IR::OpndKindSym:
        {
            IR::SymOpnd *symOpnd = opnd->AsSymOpnd();
            Sym * sym = symOpnd->m_sym;

            this->DoSetDead(symOpnd, !this->ProcessSymUse(sym, false, opnd->GetIsJITOptimizedReg()));

            if (IsCollectionPass())
            {
                break;
            }

            if (sym->IsPropertySym())
            {
                // TODO: We don't have last use info for property sym
                // and we don't set the last use of the stacksym inside the property sym
                if (tag == Js::BackwardPhase)
                {
                    if (opnd->AsSymOpnd()->IsPropertySymOpnd())
                    {
                        this->globOpt->PreparePropertySymOpndForTypeCheckSeq(symOpnd->AsPropertySymOpnd(), this->currentInstr, this->currentBlock->loop);
                    }
                }

                if (this->DoMarkTempNumbersOnTempObjects())
                {
                    this->currentBlock->tempNumberTracker->ProcessPropertySymUse(symOpnd, this->currentInstr, this);
                }

                if (symOpnd->IsPropertySymOpnd())
                {
                    this->ProcessPropertySymOpndUse(symOpnd->AsPropertySymOpnd());
                }
            }
        }
        break;
    case IR::OpndKindIndir:
        {
            IR::IndirOpnd * indirOpnd = opnd->AsIndirOpnd();
            IR::RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();

            this->DoSetDead(baseOpnd, !this->ProcessSymUse(baseOpnd->m_sym, false, baseOpnd->GetIsJITOptimizedReg()));

            IR::RegOpnd * indexOpnd = indirOpnd->GetIndexOpnd();
            if (indexOpnd)
            {
                this->DoSetDead(indexOpnd, !this->ProcessSymUse(indexOpnd->m_sym, false, indexOpnd->GetIsJITOptimizedReg()));
            }

            if(IsCollectionPass())
            {
                break;
            }

            if (this->DoMarkTempNumbersOnTempObjects())
            {
                this->currentBlock->tempNumberTracker->ProcessIndirUse(indirOpnd, currentInstr, this);
            }

            if(tag == Js::DeadStorePhase && baseOpnd->IsArrayRegOpnd())
            {
                ProcessArrayRegOpndUse(currentInstr, baseOpnd->AsArrayRegOpnd());
            }
        }
        break;
    }
}